

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  Vector<float,_4> *in_RCX;
  Type in0;
  Type in1;
  undefined8 local_70;
  float local_64 [3];
  Vector<float,_2> local_58;
  float fStack_50;
  float fStack_4c;
  int local_48 [6];
  Matrix<float,_2,_4> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_70 = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_70 = 0x3f0000003f99999a;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_58.m_data[0] = (evalCtx->coords).m_data[0];
    local_58.m_data[1] = (evalCtx->coords).m_data[1];
    fStack_50 = (evalCtx->coords).m_data[2];
    fStack_4c = (evalCtx->coords).m_data[3];
  }
  else {
    local_58.m_data[0] = (float)0x3e4ccccd;
    local_58.m_data[1] = (float)0xbf800000;
    fStack_50 = (float)0x3f000000;
    fStack_4c = (float)0x3f4ccccd;
  }
  outerProduct<float,4,2>(&local_30,(MatrixCaseUtils *)&local_70,&local_58,in_RCX);
  local_64[0] = local_30.m_data.m_data[0].m_data[0] + local_30.m_data.m_data[0].m_data[1] +
                local_30.m_data.m_data[3].m_data[0];
  local_64[1] = local_30.m_data.m_data[1].m_data[0] + local_30.m_data.m_data[1].m_data[1] +
                local_30.m_data.m_data[3].m_data[1];
  local_64[2] = local_30.m_data.m_data[2].m_data[0] + local_30.m_data.m_data[2].m_data[1];
  local_48[2] = 0;
  local_48[3] = 1;
  local_48[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[local_48[lVar1]] = *(float *)((long)&local_70 + lVar1 * 4 + 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}